

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feebumper.cpp
# Opt level: O3

CFeeRate wallet::EstimateFeeRate
                   (CWallet *wallet,CWalletTx *wtx,CAmount old_fee,CCoinControl *coin_control)

{
  int iVar1;
  int64_t iVar2;
  undefined4 extraout_var;
  CFeeRate CVar3;
  long lVar4;
  long in_FS_OFFSET;
  CFeeRate feerate;
  CFeeRate local_38;
  CAmount local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = old_fee;
  iVar2 = GetVirtualTransactionSize((CTransaction *)wtx,0,0);
  CFeeRate::CFeeRate(&local_38,&local_30,(uint32_t)iVar2);
  local_38.nSatoshisPerK = local_38.nSatoshisPerK + 1;
  if (wallet->m_chain == (Chain *)0x0) {
    __assert_fail("m_chain",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.h"
                  ,0x1f5,"interfaces::Chain &wallet::CWallet::chain() const");
  }
  iVar1 = (*wallet->m_chain->_vptr_Chain[0x1f])();
  lVar4 = 5000;
  if (5000 < CONCAT44(extraout_var,iVar1)) {
    lVar4 = CONCAT44(extraout_var,iVar1);
  }
  local_38.nSatoshisPerK = local_38.nSatoshisPerK + lVar4;
  CVar3 = GetMinimumFeeRate(wallet,coin_control,(FeeCalculation *)0x0);
  if (CVar3.nSatoshisPerK < local_38.nSatoshisPerK) {
    CVar3.nSatoshisPerK = local_38.nSatoshisPerK;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (CFeeRate)CVar3.nSatoshisPerK;
  }
  __stack_chk_fail();
}

Assistant:

static CFeeRate EstimateFeeRate(const CWallet& wallet, const CWalletTx& wtx, const CAmount old_fee, const CCoinControl& coin_control)
{
    // Get the fee rate of the original transaction. This is calculated from
    // the tx fee/vsize, so it may have been rounded down. Add 1 satoshi to the
    // result.
    int64_t txSize = GetVirtualTransactionSize(*(wtx.tx));
    CFeeRate feerate(old_fee, txSize);
    feerate += CFeeRate(1);

    // The node has a configurable incremental relay fee. Increment the fee by
    // the minimum of that and the wallet's conservative
    // WALLET_INCREMENTAL_RELAY_FEE value to future proof against changes to
    // network wide policy for incremental relay fee that our node may not be
    // aware of. This ensures we're over the required relay fee rate
    // (Rule 4).  The replacement tx will be at least as large as the
    // original tx, so the total fee will be greater (Rule 3)
    CFeeRate node_incremental_relay_fee = wallet.chain().relayIncrementalFee();
    CFeeRate wallet_incremental_relay_fee = CFeeRate(WALLET_INCREMENTAL_RELAY_FEE);
    feerate += std::max(node_incremental_relay_fee, wallet_incremental_relay_fee);

    // Fee rate must also be at least the wallet's GetMinimumFeeRate
    CFeeRate min_feerate(GetMinimumFeeRate(wallet, coin_control, /*feeCalc=*/nullptr));

    // Set the required fee rate for the replacement transaction in coin control.
    return std::max(feerate, min_feerate);
}